

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O1

Clause * __thiscall
Shell::AnswerLiteralManager::getResolverClause(AnswerLiteralManager *this,uint pred)

{
  uint arity;
  Entry *pEVar1;
  Literal *pLVar2;
  Clause *val;
  Inference *inf;
  ulong uVar3;
  SingletonIterator<Kernel::Literal_*> litit;
  uint local_60;
  NonspecificInference0 local_5a;
  Inference local_58;
  
  local_60 = pred;
  pEVar1 = ::Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
           findEntry(&this->_resolverClauses,&local_60);
  if (pEVar1 == (Entry *)0x0) {
    if (getResolverClause(unsigned_int)::args == '\0') {
      getResolverClause();
    }
    getResolverClause::args._cursor = getResolverClause::args._stack;
    arity = *(uint *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) + (ulong)local_60 * 8) + 0x20);
    if ((ulong)arity != 0) {
      uVar3 = 0;
      do {
        if (getResolverClause::args._cursor == getResolverClause::args._end) {
          ::Lib::Stack<Kernel::TermList>::expand(&getResolverClause::args);
        }
        (getResolverClause::args._cursor)->_content = (uVar3 & 0xffffffff) + 1;
        getResolverClause::args._cursor = getResolverClause::args._cursor + 1;
        uVar3 = uVar3 + 4;
      } while ((ulong)arity * 4 - uVar3 != 0);
    }
    inf = (Inference *)getResolverClause::args._stack;
    pLVar2 = Kernel::Literal::create(local_60,arity,true,getResolverClause::args._stack);
    local_5a.inputType = AXIOM;
    local_5a.rule = ANSWER_LITERAL_RESOLVER;
    Kernel::Inference::Inference(&local_58,&local_5a);
    litit._el = (Literal *)&local_58;
    litit._0_8_ = pLVar2;
    val = Kernel::Clause::fromIterator<Lib::SingletonIterator<Kernel::Literal*>>
                    ((Clause *)0x0,litit,inf);
    ::Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&this->_resolverClauses,local_60,val);
  }
  else {
    val = pEVar1->_val;
  }
  return val;
}

Assistant:

Clause* AnswerLiteralManager::getResolverClause(unsigned pred)
{
  Clause* res;
  if(_resolverClauses.find(pred, res)) {
    return res;
  }

  static Stack<TermList> args;
  args.reset();

  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  ASS(predSym->answerPredicate());
  unsigned arity = predSym->arity();

  for(unsigned i=0; i<arity; i++) {
    args.push(TermList(i, false));
  }
  Literal* lit = Literal::create(pred, arity, true, args.begin());
  res = Clause::fromIterator(getSingletonIterator(lit),NonspecificInference0(UnitInputType::AXIOM,InferenceRule::ANSWER_LITERAL_RESOLVER));

  _resolverClauses.insert(pred, res);
  return res;
}